

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastIntrinsics.h
# Opt level: O2

void NFastOps::LogAvx<true,false>(double *from,size_t size,double *to)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  double dVar70;
  undefined1 auVar71 [16];
  double dVar77;
  undefined1 auVar72 [32];
  double dVar76;
  double dVar78;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  double dVar84;
  undefined1 auVar85 [16];
  double dVar89;
  double dVar90;
  double dVar91;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  double dVar92;
  double dVar95;
  undefined1 auVar93 [16];
  double dVar96;
  undefined1 auVar94 [32];
  double dVar97;
  double dVar98;
  double dVar100;
  double dVar101;
  double dVar102;
  undefined1 auVar99 [32];
  undefined1 auVar65 [32];
  
  uVar3 = size * 8 & 0xffffffffffffffc0;
  auVar69._8_8_ = 0x3ff0000000000000;
  auVar69._0_8_ = 0x3ff0000000000000;
  auVar69._16_8_ = 0x3ff0000000000000;
  auVar69._24_8_ = 0x3ff0000000000000;
  auVar18._8_8_ = 0xfffffffffffff;
  auVar18._0_8_ = 0xfffffffffffff;
  auVar18._16_8_ = 0xfffffffffffff;
  auVar18._24_8_ = 0xfffffffffffff;
  auVar8._8_8_ = 0x4337fffffffffc01;
  auVar8._0_8_ = 0x4337fffffffffc01;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 0x40) {
    auVar80 = *(undefined1 (*) [32])((long)from + uVar4);
    auVar85 = vpsrlq_avx(auVar80._0_16_,0x34);
    auVar79 = *(undefined1 (*) [16])((long)from + uVar4 + 0x10);
    auVar71 = vpsrlq_avx(auVar79,0x34);
    auVar94._0_8_ = -(ulong)(auVar85._0_8_ == 0);
    auVar94._8_8_ = -(ulong)(auVar85._8_8_ == 0);
    auVar93._0_8_ = -(ulong)(auVar71._0_8_ == 0);
    uVar2 = (ulong)(auVar71._8_8_ == 0);
    auVar93._8_8_ = -uVar2;
    auVar94._16_16_ = auVar93;
    auVar81 = ZEXT832(0) << 0x40;
    if ((((auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
         SUB321(auVar94 >> 0x7f,0) == '\0') && SUB161(auVar93 >> 0x3f,0) == '\0') && uVar2 == 0) {
      auVar85 = vpaddq_avx(auVar85,auVar8);
      auVar71 = vpaddq_avx(auVar71,auVar8);
      dVar84 = auVar85._0_8_ + -6755399441055744.0;
      dVar89 = auVar85._8_8_ + -6755399441055744.0;
      dVar90 = auVar71._0_8_ + -6755399441055744.0;
      dVar91 = auVar71._8_8_ + -6755399441055744.0;
      auVar72 = auVar80;
    }
    else {
      auVar27._8_8_ = 0x4330000000000000;
      auVar27._0_8_ = 0x4330000000000000;
      auVar27._16_8_ = 0x4330000000000000;
      auVar27._24_8_ = 0x4330000000000000;
      auVar27 = vblendvpd_avx(auVar69,auVar27,auVar94);
      auVar71._0_8_ = auVar80._0_8_ * auVar27._0_8_;
      auVar71._8_8_ = auVar80._8_8_ * auVar27._8_8_;
      auVar72._16_8_ = auVar80._16_8_ * auVar27._16_8_;
      auVar72._0_16_ = auVar71;
      auVar72._24_8_ = auVar80._24_8_ * auVar27._24_8_;
      auVar28._8_8_ = 0xc04a000000000000;
      auVar28._0_8_ = 0xc04a000000000000;
      auVar28._16_8_ = 0xc04a000000000000;
      auVar28._24_8_ = 0xc04a000000000000;
      auVar94 = vblendvpd_avx(auVar81,auVar28,auVar94);
      auVar71 = vpsrlq_avx(auVar71,0x34);
      auVar85 = vpsrlq_avx(auVar72._16_16_,0x34);
      auVar71 = vpaddq_avx(auVar71,auVar8);
      auVar85 = vpaddq_avx(auVar85,auVar8);
      dVar84 = auVar94._0_8_ + auVar71._0_8_ + -6755399441055744.0;
      dVar89 = auVar94._8_8_ + auVar71._8_8_ + -6755399441055744.0;
      dVar90 = auVar94._16_8_ + auVar85._0_8_ + -6755399441055744.0;
      dVar91 = auVar94._24_8_ + auVar85._8_8_ + -6755399441055744.0;
    }
    auVar94 = vandpd_avx(auVar72,auVar18);
    auVar29._8_8_ = 0x3fe0000000000000;
    auVar29._0_8_ = 0x3fe0000000000000;
    auVar29._16_8_ = 0x3fe0000000000000;
    auVar29._24_8_ = 0x3fe0000000000000;
    auVar72 = vorpd_avx(auVar94,auVar29);
    auVar30._8_8_ = 0x3fe6a09e667f3bcd;
    auVar30._0_8_ = 0x3fe6a09e667f3bcd;
    auVar30._16_8_ = 0x3fe6a09e667f3bcd;
    auVar30._24_8_ = 0x3fe6a09e667f3bcd;
    auVar27 = vcmppd_avx(auVar30,auVar72,1);
    auVar94 = vandnpd_avx(auVar27,auVar72);
    dVar70 = auVar94._0_8_ + auVar72._0_8_;
    dVar76 = auVar94._8_8_ + auVar72._8_8_;
    dVar77 = auVar94._16_8_ + auVar72._16_8_;
    dVar78 = auVar94._24_8_ + auVar72._24_8_;
    auVar94 = vandpd_avx(auVar27,auVar69);
    dVar92 = dVar70 + -1.0;
    dVar95 = dVar76 + -1.0;
    dVar96 = dVar77 + -1.0;
    dVar97 = dVar78 + -1.0;
    dVar98 = dVar92 * dVar92;
    dVar100 = dVar95 * dVar95;
    dVar101 = dVar96 * dVar96;
    dVar102 = dVar97 * dVar97;
    auVar86._0_8_ =
         (dVar84 + auVar94._0_8_) * 0.6931471805599453 +
         dVar92 * ((dVar98 + dVar70 * -0.12132034355964258) *
                   (dVar92 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar98 * (dVar92 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar98 * dVar98 *
                   (dVar98 * (dVar92 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar92 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar92 * -0.4901290717342736 + 1.0397207708399179);
    auVar86._8_8_ =
         (dVar89 + auVar94._8_8_) * 0.6931471805599453 +
         dVar95 * ((dVar100 + dVar76 * -0.12132034355964258) *
                   (dVar95 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar100 * (dVar95 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar100 * dVar100 *
                   (dVar100 * (dVar95 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar95 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar95 * -0.4901290717342736 + 1.0397207708399179);
    auVar86._16_8_ =
         (dVar90 + auVar94._16_8_) * 0.6931471805599453 +
         dVar96 * ((dVar101 + dVar77 * -0.12132034355964258) *
                   (dVar96 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar101 * (dVar96 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar101 * dVar101 *
                   (dVar101 * (dVar96 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar96 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar96 * -0.4901290717342736 + 1.0397207708399179);
    auVar86._24_8_ =
         (dVar91 + auVar94._24_8_) * 0.6931471805599453 +
         dVar97 * ((dVar102 + dVar78 * -0.12132034355964258) *
                   (dVar97 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar102 * (dVar97 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar102 * dVar102 *
                   (dVar102 * (dVar97 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar97 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar97 * -0.4901290717342736 + 1.0397207708399179);
    auVar82._8_8_ = -(ulong)(auVar80._8_8_ == INFINITY);
    auVar82._0_8_ = -(ulong)(auVar80._0_8_ == INFINITY);
    auVar82._24_8_ = -(ulong)(auVar79._8_8_ == 0x7ff0000000000000);
    auVar82._16_8_ = -(ulong)(auVar79._0_8_ == 0x7ff0000000000000);
    auVar94 = vcmppd_avx(auVar81,auVar80,1);
    auVar94 = vandnpd_avx(auVar82,auVar94);
    auVar94 = _DAT_00180fc0 & ~auVar94;
    if ((((auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
         SUB321(auVar94 >> 0x7f,0) != '\0') || SUB321(auVar94 >> 0xbf,0) != '\0') ||
        auVar94[0x1f] < '\0') {
      auVar94 = vcmppd_avx(auVar80,auVar81,0);
      auVar72 = vorpd_avx(auVar82,auVar94);
      auVar53._8_8_ = 0xfff0000000000000;
      auVar53._0_8_ = 0xfff0000000000000;
      auVar53._16_8_ = 0xfff0000000000000;
      auVar53._24_8_ = 0xfff0000000000000;
      auVar83._8_8_ = 0x7ff0000000000000;
      auVar83._0_8_ = 0x7ff0000000000000;
      auVar83._16_8_ = 0x7ff0000000000000;
      auVar83._24_8_ = 0x7ff0000000000000;
      auVar94 = vblendvpd_avx(auVar83,auVar53,auVar94);
      auVar94 = vblendvpd_avx(auVar80,auVar94,auVar72);
      auVar27 = vcmppd_avx(auVar80,auVar81,3);
      auVar27 = vorpd_avx(auVar27,auVar72);
      auVar54._8_8_ = 0x8000000000000000;
      auVar54._0_8_ = 0x8000000000000000;
      auVar54._16_8_ = 0x8000000000000000;
      auVar54._24_8_ = 0x8000000000000000;
      auVar80 = vandpd_avx(auVar80,auVar54);
      auVar71 = vpsrad_avx(auVar80._0_16_,0xc);
      auVar79 = vpsrad_avx(auVar80._16_16_,0xc);
      auVar80._0_8_ = auVar86._0_8_ + auVar71._0_8_;
      auVar80._8_8_ = auVar86._8_8_ + auVar71._8_8_;
      auVar80._16_8_ = auVar86._16_8_ + auVar79._0_8_;
      auVar80._24_8_ = auVar86._24_8_ + auVar79._8_8_;
      auVar86 = vblendvpd_avx(auVar80,auVar94,auVar27);
    }
    *(undefined1 (*) [32])((long)to + uVar4) = auVar86;
    auVar80 = *(undefined1 (*) [32])((long)from + uVar4 + 0x20);
    auVar93 = vpsrlq_avx(auVar80._0_16_,0x34);
    auVar79 = *(undefined1 (*) [16])((long)from + uVar4 + 0x30);
    auVar71 = vpsrlq_avx(auVar79,0x34);
    auVar99._8_8_ = -(ulong)(auVar93._8_8_ == 0);
    auVar99._0_8_ = -(ulong)(auVar93._0_8_ == 0);
    auVar85._0_8_ = -(ulong)(auVar71._0_8_ == 0);
    uVar2 = (ulong)(auVar71._8_8_ == 0);
    auVar85._8_8_ = -uVar2;
    auVar99._16_16_ = auVar85;
    if ((((auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
         SUB321(auVar99 >> 0x7f,0) == '\0') && SUB161(auVar85 >> 0x3f,0) == '\0') && uVar2 == 0) {
      auVar85 = vpaddq_avx(auVar93,auVar8);
      auVar71 = vpaddq_avx(auVar71,auVar8);
      dVar84 = auVar85._0_8_ + -6755399441055744.0;
      dVar89 = auVar85._8_8_ + -6755399441055744.0;
      dVar90 = auVar71._0_8_ + -6755399441055744.0;
      dVar91 = auVar71._8_8_ + -6755399441055744.0;
      auVar87 = auVar80;
    }
    else {
      auVar31._8_8_ = 0x4330000000000000;
      auVar31._0_8_ = 0x4330000000000000;
      auVar31._16_8_ = 0x4330000000000000;
      auVar31._24_8_ = 0x4330000000000000;
      auVar94 = vblendvpd_avx(auVar69,auVar31,auVar99);
      auVar17._0_8_ = auVar80._0_8_ * auVar94._0_8_;
      auVar17._8_8_ = auVar80._8_8_ * auVar94._8_8_;
      auVar87._16_8_ = auVar80._16_8_ * auVar94._16_8_;
      auVar87._0_16_ = auVar17;
      auVar87._24_8_ = auVar80._24_8_ * auVar94._24_8_;
      auVar32._8_8_ = 0xc04a000000000000;
      auVar32._0_8_ = 0xc04a000000000000;
      auVar32._16_8_ = 0xc04a000000000000;
      auVar32._24_8_ = 0xc04a000000000000;
      auVar94 = vblendvpd_avx(auVar81,auVar32,auVar99);
      auVar71 = vpsrlq_avx(auVar17,0x34);
      auVar85 = vpsrlq_avx(auVar87._16_16_,0x34);
      auVar71 = vpaddq_avx(auVar71,auVar8);
      auVar85 = vpaddq_avx(auVar85,auVar8);
      dVar84 = auVar94._0_8_ + auVar71._0_8_ + -6755399441055744.0;
      dVar89 = auVar94._8_8_ + auVar71._8_8_ + -6755399441055744.0;
      dVar90 = auVar94._16_8_ + auVar85._0_8_ + -6755399441055744.0;
      dVar91 = auVar94._24_8_ + auVar85._8_8_ + -6755399441055744.0;
    }
    auVar94 = vandpd_avx(auVar87,auVar18);
    auVar19._8_8_ = 0x3fe0000000000000;
    auVar19._0_8_ = 0x3fe0000000000000;
    auVar19._16_8_ = 0x3fe0000000000000;
    auVar19._24_8_ = 0x3fe0000000000000;
    auVar72 = vorpd_avx(auVar94,auVar19);
    auVar20._8_8_ = 0x3fe6a09e667f3bcd;
    auVar20._0_8_ = 0x3fe6a09e667f3bcd;
    auVar20._16_8_ = 0x3fe6a09e667f3bcd;
    auVar20._24_8_ = 0x3fe6a09e667f3bcd;
    auVar27 = vcmppd_avx(auVar20,auVar72,1);
    auVar94 = vandnpd_avx(auVar27,auVar72);
    dVar70 = auVar94._0_8_ + auVar72._0_8_;
    dVar76 = auVar94._8_8_ + auVar72._8_8_;
    dVar77 = auVar94._16_8_ + auVar72._16_8_;
    dVar78 = auVar94._24_8_ + auVar72._24_8_;
    auVar94 = vandpd_avx(auVar69,auVar27);
    dVar92 = dVar70 + -1.0;
    dVar95 = dVar76 + -1.0;
    dVar96 = dVar77 + -1.0;
    dVar97 = dVar78 + -1.0;
    dVar98 = dVar92 * dVar92;
    dVar100 = dVar95 * dVar95;
    dVar101 = dVar96 * dVar96;
    dVar102 = dVar97 * dVar97;
    auVar88._0_8_ =
         (dVar84 + auVar94._0_8_) * 0.6931471805599453 +
         dVar92 * ((dVar98 + dVar70 * -0.12132034355964258) *
                   (dVar92 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar98 * (dVar92 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar98 * dVar98 *
                   (dVar98 * (dVar92 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar92 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar92 * -0.4901290717342736 + 1.0397207708399179);
    auVar88._8_8_ =
         (dVar89 + auVar94._8_8_) * 0.6931471805599453 +
         dVar95 * ((dVar100 + dVar76 * -0.12132034355964258) *
                   (dVar95 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar100 * (dVar95 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar100 * dVar100 *
                   (dVar100 * (dVar95 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar95 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar95 * -0.4901290717342736 + 1.0397207708399179);
    auVar88._16_8_ =
         (dVar90 + auVar94._16_8_) * 0.6931471805599453 +
         dVar96 * ((dVar101 + dVar77 * -0.12132034355964258) *
                   (dVar96 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar101 * (dVar96 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar101 * dVar101 *
                   (dVar101 * (dVar96 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar96 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar96 * -0.4901290717342736 + 1.0397207708399179);
    auVar88._24_8_ =
         (dVar91 + auVar94._24_8_) * 0.6931471805599453 +
         dVar97 * ((dVar102 + dVar78 * -0.12132034355964258) *
                   (dVar97 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar102 * (dVar97 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar102 * dVar102 *
                   (dVar102 * (dVar97 * -0.0766482905246683 + 0.12052759639123857) +
                   dVar97 * -0.12732281415503188 + 0.14089176364079287)) +
                   dVar97 * -0.4901290717342736 + 1.0397207708399179);
    auVar73._24_8_ = -(ulong)(auVar79._8_8_ == 0x7ff0000000000000);
    auVar73._16_8_ = -(ulong)(auVar79._0_8_ == 0x7ff0000000000000);
    auVar73._8_8_ = -(ulong)(auVar80._8_8_ == INFINITY);
    auVar73._0_8_ = -(ulong)(auVar80._0_8_ == INFINITY);
    auVar94 = vcmppd_avx(auVar81,auVar80,1);
    auVar94 = vandnpd_avx(auVar73,auVar94);
    auVar94 = _DAT_00180fc0 & ~auVar94;
    if ((((auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
         SUB321(auVar94 >> 0x7f,0) != '\0') || SUB321(auVar94 >> 0xbf,0) != '\0') ||
        auVar94[0x1f] < '\0') {
      auVar94 = vcmppd_avx(auVar80,auVar81,0);
      auVar27 = vorpd_avx(auVar73,auVar94);
      auVar55._8_8_ = 0xfff0000000000000;
      auVar55._0_8_ = 0xfff0000000000000;
      auVar55._16_8_ = 0xfff0000000000000;
      auVar55._24_8_ = 0xfff0000000000000;
      auVar74._8_8_ = 0x7ff0000000000000;
      auVar74._0_8_ = 0x7ff0000000000000;
      auVar74._16_8_ = 0x7ff0000000000000;
      auVar74._24_8_ = 0x7ff0000000000000;
      auVar94 = vblendvpd_avx(auVar74,auVar55,auVar94);
      auVar94 = vblendvpd_avx(auVar80,auVar94,auVar27);
      auVar81 = vcmppd_avx(auVar80,auVar81,3);
      auVar81 = vorpd_avx(auVar81,auVar27);
      auVar56._8_8_ = 0x8000000000000000;
      auVar56._0_8_ = 0x8000000000000000;
      auVar56._16_8_ = 0x8000000000000000;
      auVar56._24_8_ = 0x8000000000000000;
      auVar80 = vandpd_avx(auVar80,auVar56);
      auVar71 = vpsrad_avx(auVar80._0_16_,0xc);
      auVar79 = vpsrad_avx(auVar80._16_16_,0xc);
      auVar57._0_8_ = auVar88._0_8_ + auVar71._0_8_;
      auVar57._8_8_ = auVar88._8_8_ + auVar71._8_8_;
      auVar57._16_8_ = auVar88._16_8_ + auVar79._0_8_;
      auVar57._24_8_ = auVar88._24_8_ + auVar79._8_8_;
      auVar88 = vblendvpd_avx(auVar57,auVar94,auVar81);
    }
    *(undefined1 (*) [32])((long)to + uVar4 + 0x20) = auVar88;
  }
  pauVar6 = (undefined1 (*) [32])((long)from + uVar3);
  pauVar5 = (undefined1 (*) [32])((long)to + uVar3);
  if ((size & 4) != 0) {
    auVar80 = *pauVar6;
    auVar85 = vpsrlq_avx(auVar80._0_16_,0x34);
    auVar79 = *(undefined1 (*) [16])(*pauVar6 + 0x10);
    auVar71 = vpsrlq_avx(auVar79,0x34);
    auVar81._8_8_ = -(ulong)(auVar85._8_8_ == 0);
    auVar81._0_8_ = -(ulong)(auVar85._0_8_ == 0);
    auVar21._0_8_ = -(ulong)(auVar71._0_8_ == 0);
    uVar3 = (ulong)(auVar71._8_8_ == 0);
    auVar21._8_8_ = -uVar3;
    auVar81._16_16_ = auVar21;
    if ((((auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
         SUB321(auVar81 >> 0x7f,0) == '\0') && SUB161(auVar21 >> 0x3f,0) == '\0') && uVar3 == 0) {
      auVar85 = vpaddq_avx(auVar85,auVar8);
      auVar71 = vpaddq_avx(auVar71,auVar8);
      auVar46._8_8_ = -6755399441055744.0;
      auVar46._0_8_ = -6755399441055744.0;
      auVar46._16_8_ = -6755399441055744.0;
      auVar46._24_8_ = -6755399441055744.0;
      dVar84 = auVar85._0_8_ + -6755399441055744.0;
      dVar89 = auVar85._8_8_ + -6755399441055744.0;
      dVar90 = auVar71._0_8_ + -6755399441055744.0;
      dVar91 = auVar71._8_8_ + -6755399441055744.0;
      auVar65 = auVar80;
    }
    else {
      auVar33._8_8_ = 0x4330000000000000;
      auVar33._0_8_ = 0x4330000000000000;
      auVar33._16_8_ = 0x4330000000000000;
      auVar33._24_8_ = 0x4330000000000000;
      auVar94 = vblendvpd_avx(auVar69,auVar33,auVar81);
      auVar62._0_8_ = auVar80._0_8_ * auVar94._0_8_;
      auVar62._8_8_ = auVar80._8_8_ * auVar94._8_8_;
      auVar65._16_8_ = auVar80._16_8_ * auVar94._16_8_;
      auVar65._0_16_ = auVar62;
      auVar65._24_8_ = auVar80._24_8_ * auVar94._24_8_;
      auVar47._8_8_ = 0xc04a000000000000;
      auVar47._0_8_ = 0xc04a000000000000;
      auVar47._16_8_ = 0xc04a000000000000;
      auVar47._24_8_ = 0xc04a000000000000;
      auVar81 = vblendvpd_avx(ZEXT832(0) << 0x40,auVar47,auVar81);
      auVar71 = vpsrlq_avx(auVar62,0x34);
      auVar85 = vpsrlq_avx(auVar65._16_16_,0x34);
      auVar71 = vpaddq_avx(auVar71,auVar8);
      auVar85 = vpaddq_avx(auVar85,auVar8);
      auVar46._0_8_ = auVar71._0_8_ + -6755399441055744.0;
      auVar46._8_8_ = auVar71._8_8_ + -6755399441055744.0;
      auVar46._16_8_ = auVar85._0_8_ + -6755399441055744.0;
      auVar46._24_8_ = auVar85._8_8_ + -6755399441055744.0;
      dVar84 = auVar81._0_8_ + auVar46._0_8_;
      dVar89 = auVar81._8_8_ + auVar46._8_8_;
      dVar90 = auVar81._16_8_ + auVar46._16_8_;
      dVar91 = auVar81._24_8_ + auVar46._24_8_;
    }
    auVar75._24_8_ = -(ulong)(auVar79._8_8_ == 0x7ff0000000000000);
    auVar75._16_8_ = -(ulong)(auVar79._0_8_ == 0x7ff0000000000000);
    auVar75._8_8_ = -(ulong)(auVar80._8_8_ == INFINITY);
    auVar75._0_8_ = -(ulong)(auVar80._0_8_ == INFINITY);
    auVar81 = vcmppd_avx(ZEXT1632((undefined1  [16])0x0),auVar80,1);
    auVar81 = vandnpd_avx(auVar75,auVar81);
    auVar94 = vcmpps_avx(auVar46,auVar46,0xf);
    auVar94 = auVar94 & ~auVar81;
    auVar18 = vandpd_avx(auVar18,auVar65);
    auVar48._8_8_ = 0x3fe0000000000000;
    auVar48._0_8_ = 0x3fe0000000000000;
    auVar48._16_8_ = 0x3fe0000000000000;
    auVar48._24_8_ = 0x3fe0000000000000;
    auVar27 = vorpd_avx(auVar18,auVar48);
    auVar49._8_8_ = 0x3fe6a09e667f3bcd;
    auVar49._0_8_ = 0x3fe6a09e667f3bcd;
    auVar49._16_8_ = 0x3fe6a09e667f3bcd;
    auVar49._24_8_ = 0x3fe6a09e667f3bcd;
    auVar81 = vcmppd_avx(auVar49,auVar27,1);
    auVar18 = vandnpd_avx(auVar81,auVar27);
    dVar70 = auVar18._0_8_ + auVar27._0_8_;
    dVar76 = auVar18._8_8_ + auVar27._8_8_;
    dVar77 = auVar18._16_8_ + auVar27._16_8_;
    dVar78 = auVar18._24_8_ + auVar27._24_8_;
    auVar18 = vandpd_avx(auVar69,auVar81);
    dVar92 = dVar70 + -1.0;
    dVar95 = dVar76 + -1.0;
    dVar96 = dVar77 + -1.0;
    dVar97 = dVar78 + -1.0;
    dVar98 = dVar92 * dVar92;
    dVar100 = dVar95 * dVar95;
    dVar101 = dVar96 * dVar96;
    dVar102 = dVar97 * dVar97;
    auVar34._0_8_ =
         (dVar84 + auVar18._0_8_) * 0.6931471805599453 +
         dVar92 * ((dVar98 + dVar70 * -0.12132034355964258) *
                   (dVar92 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar98 * (dVar92 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar98 * dVar98 *
                   (dVar92 * -0.12732281415503188 + 0.14089176364079287 +
                   dVar98 * (dVar92 * -0.0766482905246683 + 0.12052759639123857))) +
                   dVar92 * -0.4901290717342736 + 1.0397207708399179);
    auVar34._8_8_ =
         (dVar89 + auVar18._8_8_) * 0.6931471805599453 +
         dVar95 * ((dVar100 + dVar76 * -0.12132034355964258) *
                   (dVar95 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar100 * (dVar95 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar100 * dVar100 *
                   (dVar95 * -0.12732281415503188 + 0.14089176364079287 +
                   dVar100 * (dVar95 * -0.0766482905246683 + 0.12052759639123857))) +
                   dVar95 * -0.4901290717342736 + 1.0397207708399179);
    auVar34._16_8_ =
         (dVar90 + auVar18._16_8_) * 0.6931471805599453 +
         dVar96 * ((dVar101 + dVar77 * -0.12132034355964258) *
                   (dVar96 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar101 * (dVar96 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar101 * dVar101 *
                   (dVar96 * -0.12732281415503188 + 0.14089176364079287 +
                   dVar101 * (dVar96 * -0.0766482905246683 + 0.12052759639123857))) +
                   dVar96 * -0.4901290717342736 + 1.0397207708399179);
    auVar34._24_8_ =
         (dVar91 + auVar18._24_8_) * 0.6931471805599453 +
         dVar97 * ((dVar102 + dVar78 * -0.12132034355964258) *
                   (dVar97 * -0.24604261088172152 + 0.3274040414833277 +
                    dVar102 * (dVar97 * -0.16440826988949675 + 0.19717056511718561) +
                   dVar102 * dVar102 *
                   (dVar97 * -0.12732281415503188 + 0.14089176364079287 +
                   dVar102 * (dVar97 * -0.0766482905246683 + 0.12052759639123857))) +
                   dVar97 * -0.4901290717342736 + 1.0397207708399179);
    if ((((auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
         SUB321(auVar94 >> 0x7f,0) != '\0') || SUB321(auVar94 >> 0xbf,0) != '\0') ||
        auVar94[0x1f] < '\0') {
      auVar18 = vcmppd_avx(auVar80,ZEXT1632((undefined1  [16])0x0),0);
      auVar81 = vorpd_avx(auVar75,auVar18);
      auVar61._8_8_ = 0xfff0000000000000;
      auVar61._0_8_ = 0xfff0000000000000;
      auVar61._16_8_ = 0xfff0000000000000;
      auVar61._24_8_ = 0xfff0000000000000;
      auVar66._8_8_ = 0x7ff0000000000000;
      auVar66._0_8_ = 0x7ff0000000000000;
      auVar66._16_8_ = 0x7ff0000000000000;
      auVar66._24_8_ = 0x7ff0000000000000;
      auVar18 = vblendvpd_avx(auVar66,auVar61,auVar18);
      auVar69 = vblendvpd_avx(auVar80,auVar18,auVar81);
      auVar18 = vcmppd_avx(auVar80,ZEXT1632((undefined1  [16])0x0),3);
      auVar81 = vorpd_avx(auVar18,auVar81);
      auVar58._8_8_ = 0x8000000000000000;
      auVar58._0_8_ = 0x8000000000000000;
      auVar58._16_8_ = 0x8000000000000000;
      auVar58._24_8_ = 0x8000000000000000;
      auVar18 = vandpd_avx(auVar80,auVar58);
      auVar71 = vpsrad_avx(auVar18._0_16_,0xc);
      auVar79 = vpsrad_avx(auVar18._16_16_,0xc);
      auVar12._0_8_ = auVar34._0_8_ + auVar71._0_8_;
      auVar12._8_8_ = auVar34._8_8_ + auVar71._8_8_;
      auVar12._16_8_ = auVar34._16_8_ + auVar79._0_8_;
      auVar12._24_8_ = auVar34._24_8_ + auVar79._8_8_;
      auVar34 = vblendvpd_avx(auVar12,auVar69,auVar81);
    }
    *pauVar5 = auVar34;
    pauVar5 = pauVar5 + 1;
    pauVar6 = pauVar6 + 1;
  }
  if ((size & 2) != 0) {
    auVar79 = *(undefined1 (*) [16])*pauVar6;
    dVar84 = auVar79._0_8_;
    auVar13._0_8_ = -dVar84;
    auVar13._8_4_ = auVar79._8_4_;
    auVar13._12_4_ = auVar79._12_4_ ^ 0x80000000;
    auVar22._8_8_ = 0x800fffffffffffff;
    auVar22._0_8_ = 0x800fffffffffffff;
    auVar85 = vpcmpgtq_avx(auVar13,auVar22);
    auVar71 = vpcmpeqd_avx(auVar13,auVar13);
    if (((auVar71 & ~auVar85) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar71 & ~auVar85,0xf)) {
      auVar71 = vpsrlq_avx(auVar79,0x34);
      auVar71 = vpaddq_avx(auVar71,auVar8);
      dVar89 = auVar71._0_8_ + -6755399441055744.0;
      dVar90 = auVar71._8_8_ + -6755399441055744.0;
      auVar15 = auVar79;
    }
    else {
      auVar14._8_8_ = 0x3ff0000000000000;
      auVar14._0_8_ = 0x3ff0000000000000;
      auVar35._8_8_ = 0x4330000000000000;
      auVar35._0_8_ = 0x4330000000000000;
      auVar71 = vblendvpd_avx(auVar35,auVar14,auVar85);
      auVar15._0_8_ = dVar84 * auVar71._0_8_;
      auVar15._8_8_ = auVar79._8_8_ * auVar71._8_8_;
      auVar36._8_8_ = 0xc04a000000000000;
      auVar36._0_8_ = 0xc04a000000000000;
      auVar71 = vandnpd_avx(auVar85,auVar36);
      auVar85 = vpsrlq_avx(auVar15,0x34);
      auVar85 = vpaddq_avx(auVar85,auVar8);
      dVar89 = auVar71._0_8_ + auVar85._0_8_ + -6755399441055744.0;
      dVar90 = auVar71._8_8_ + auVar85._8_8_ + -6755399441055744.0;
    }
    auVar37._8_8_ = 0xfffffffffffff;
    auVar37._0_8_ = 0xfffffffffffff;
    auVar71 = vandpd_avx(auVar15,auVar37);
    auVar38._8_8_ = 0x3fe0000000000000;
    auVar38._0_8_ = 0x3fe0000000000000;
    auVar93 = vorpd_avx(auVar71,auVar38);
    auVar16._8_8_ = 0x3fe6a09e667f3bcd;
    auVar16._0_8_ = 0x3fe6a09e667f3bcd;
    auVar85 = vcmppd_avx(auVar16,auVar93,1);
    auVar71 = vandnpd_avx(auVar85,auVar93);
    auVar17 = ZEXT816(0);
    dVar78 = auVar71._0_8_ + auVar93._0_8_;
    dVar92 = auVar71._8_8_ + auVar93._8_8_;
    auVar39._8_8_ = 0x3ff0000000000000;
    auVar39._0_8_ = 0x3ff0000000000000;
    auVar71 = vandpd_avx(auVar85,auVar39);
    dVar91 = dVar78 + -1.0;
    dVar70 = dVar92 + -1.0;
    dVar76 = dVar91 * dVar91;
    dVar77 = dVar70 * dVar70;
    auVar63._0_8_ =
         dVar76 * dVar76 *
         (dVar91 * -0.12732281415503188 + 0.14089176364079287 +
         (dVar91 * -0.0766482905246683 + 0.12052759639123857) * dVar76) +
         (dVar91 * -0.16440826988949675 + 0.19717056511718561) * dVar76 +
         dVar91 * -0.24604261088172152 + 0.3274040414833277;
    auVar63._8_8_ =
         dVar77 * dVar77 *
         (dVar70 * -0.12732281415503188 + 0.14089176364079287 +
         (dVar70 * -0.0766482905246683 + 0.12052759639123857) * dVar77) +
         (dVar70 * -0.16440826988949675 + 0.19717056511718561) * dVar77 +
         dVar70 * -0.24604261088172152 + 0.3274040414833277;
    auVar23._0_8_ =
         (dVar89 + auVar71._0_8_) * 0.6931471805599453 +
         dVar91 * ((dVar76 + dVar78 * -0.12132034355964258) * auVar63._0_8_ +
                   dVar91 * -0.4901290717342736 + 1.0397207708399179);
    auVar23._8_8_ =
         (dVar90 + auVar71._8_8_) * 0.6931471805599453 +
         dVar70 * ((dVar77 + dVar92 * -0.12132034355964258) * auVar63._8_8_ +
                   dVar70 * -0.4901290717342736 + 1.0397207708399179);
    auVar50._8_8_ = 0x7ff0000000000000;
    auVar50._0_8_ = 0x7ff0000000000000;
    auVar71 = vcmppd_avx(auVar17,auVar79,1);
    auVar40._0_8_ = -(ulong)(dVar84 == INFINITY);
    auVar40._8_8_ = -(ulong)(auVar79._8_8_ == INFINITY);
    auVar71 = vpandn_avx(auVar40,auVar71);
    auVar85 = vpcmpeqd_avx(auVar63,auVar63);
    if (((auVar85 & ~auVar71) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
        SUB161(auVar85 & ~auVar71,0xf) < '\0') {
      auVar71 = vblendvpd_avx(auVar79,auVar50,auVar40);
      auVar85 = vcmppd_avx(auVar79,auVar17,0);
      auVar64._8_8_ = 0xfff0000000000000;
      auVar64._0_8_ = 0xfff0000000000000;
      auVar71 = vblendvpd_avx(auVar71,auVar64,auVar85);
      auVar85 = vcmppd_avx(auVar79,auVar17,8);
      auVar79 = vpsrad_avx(auVar79,0xc);
      auVar93 = vpand_avx(auVar79,_DAT_00180d40);
      auVar79 = vorpd_avx(auVar40,auVar85);
      auVar10._0_8_ = auVar23._0_8_ + auVar93._0_8_;
      auVar10._8_8_ = auVar23._8_8_ + auVar93._8_8_;
      auVar23 = vblendvpd_avx(auVar10,auVar71,auVar79);
    }
    *(undefined1 (*) [16])*pauVar5 = auVar23;
    pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
    pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
  }
  if ((size & 1) != 0) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)*pauVar6;
    auVar79 = vorps_avx(auVar11,_DAT_00180d50);
    dVar84 = auVar79._0_8_;
    auVar24._0_8_ = -dVar84;
    auVar24._8_4_ = auVar79._8_4_;
    auVar24._12_4_ = auVar79._12_4_ ^ 0x80000000;
    auVar41._8_8_ = 0x800fffffffffffff;
    auVar41._0_8_ = 0x800fffffffffffff;
    auVar85 = vpcmpgtq_avx(auVar24,auVar41);
    auVar71 = vpcmpeqd_avx(auVar41,auVar41);
    dVar89 = auVar79._8_8_;
    if (((auVar71 & ~auVar85) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar71 & ~auVar85,0xf)) {
      auVar71 = vpsrlq_avx(auVar79,0x34);
      auVar8 = vpaddq_avx(auVar71,auVar8);
      dVar90 = auVar8._0_8_ + -6755399441055744.0;
      auVar25 = auVar11;
    }
    else {
      auVar71 = vblendvpd_avx(ZEXT816(0x4330000000000000),ZEXT816(0x3ff0000000000000),auVar85);
      auVar42._0_8_ = auVar71._0_8_ * dVar84;
      auVar42._8_8_ = auVar71._8_8_ * dVar89;
      auVar51._8_8_ = 0xc04a000000000000;
      auVar51._0_8_ = 0xc04a000000000000;
      auVar71 = vandnpd_avx(auVar85,auVar51);
      auVar25._8_8_ = dVar89;
      auVar25._0_8_ = auVar42._0_8_;
      auVar85 = vpsrlq_avx(auVar42,0x34);
      auVar8 = vpaddq_avx(auVar85,auVar8);
      dVar90 = auVar71._0_8_ + auVar8._0_8_ + -6755399441055744.0;
    }
    auVar43._8_8_ = 0xfffffffffffff;
    auVar43._0_8_ = 0xfffffffffffff;
    auVar8 = vandps_avx(auVar25,auVar43);
    auVar44._8_8_ = 0x3fe0000000000000;
    auVar44._0_8_ = 0x3fe0000000000000;
    auVar71 = vorps_avx(auVar8,auVar44);
    auVar45._8_8_ = 0x3fe6a09e667f3bcd;
    auVar45._0_8_ = 0x3fe6a09e667f3bcd;
    auVar8 = vcmppd_avx(auVar45,auVar71,1);
    dVar70 = 0.0;
    bVar7 = (auVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    dVar91 = 0.0;
    if (bVar7) {
      dVar91 = auVar71._0_8_;
    }
    dVar91 = dVar91 + auVar71._0_8_;
    if (!bVar7) {
      dVar70 = 1.0;
    }
    dVar76 = dVar91 + -1.0;
    dVar77 = dVar76 * dVar76;
    auVar59._0_8_ =
         dVar76 * -0.24604261088172152 + 0.3274040414833277 +
         dVar77 * (dVar76 * -0.16440826988949675 + 0.19717056511718561);
    auVar59._8_8_ =
         dVar76 * -0.12732281415503188 + 0.14089176364079287 +
         dVar77 * (dVar76 * -0.0766482905246683 + 0.12052759639123857);
    auVar8 = vshufpd_avx(auVar59,auVar59,1);
    dVar90 = (dVar90 + dVar70) * 0.6931471805599453 +
             dVar76 * ((dVar77 + dVar91 * -0.12132034355964258) *
                       (auVar59._0_8_ + dVar77 * dVar77 * auVar8._0_8_) +
                       dVar76 * -0.4901290717342736 + 1.0397207708399179);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar90;
    auVar8 = vblendpd_avx(auVar26,_DAT_00180de0,2);
    auVar60._8_8_ = 0x7ff0000000000000;
    auVar60._0_8_ = 0x7ff0000000000000;
    auVar52._0_8_ = -(ulong)(dVar84 == INFINITY);
    auVar52._8_8_ = -(ulong)(dVar89 == INFINITY);
    auVar93 = ZEXT816(0);
    auVar71 = vcmppd_avx(auVar93,auVar79,1);
    auVar71 = vpandn_avx(auVar52,auVar71);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar77 * dVar77;
    auVar85 = vpcmpeqd_avx(auVar67,auVar67);
    if (((auVar85 & ~auVar71) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
        SUB161(auVar85 & ~auVar71,0xf) < '\0') {
      auVar85 = vcmpsd_avx(auVar79,auVar93,0);
      auVar68._8_8_ = 0xfff0000000000000;
      auVar68._0_8_ = 0xfff0000000000000;
      auVar71 = vblendvpd_avx(auVar60,auVar68,auVar85);
      auVar85 = vorpd_avx(auVar85,auVar52);
      auVar71 = vblendvpd_avx(auVar79,auVar71,auVar85);
      auVar79 = vcmppd_avx(auVar79,auVar93,3);
      auVar79 = vorpd_avx(auVar79,auVar85);
      auVar85 = vpsrad_avx(auVar11,0xc);
      auVar85 = vpand_avx(auVar85,_DAT_00180d90);
      auVar9._8_8_ = auVar8._8_8_;
      auVar9._0_8_ = auVar85._0_8_ + dVar90;
      auVar8 = vblendvpd_avx(auVar9,auVar71,auVar79);
    }
    uVar1 = vmovlpd_avx(auVar8);
    *(undefined8 *)*pauVar5 = uVar1;
  }
  return;
}

Assistant:

FORCE_INLINE void AVXLn(const P_Type1& from, size_t size, P_Type2&& to) noexcept {
        AVX_FLOAT_MATH_FUNC_CALL((AVXCopy<false, I_OutAligned>), S_Ln, LN_PARAMS_COMMON_SIZE, LN_PARAMS_DOUBLE, LN_PARAMS_FLOAT, LN_PARAMS_APPROX);
    }